

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSymm.c
# Opt level: O3

void Abc_NtkSymmetries(Abc_Ntk_t *pNtk,int fUseBdds,int fNaive,int fReorder,int fVerbose)

{
  Abc_Obj_t *pObj;
  int *piVar1;
  char **ppcVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  DdManager *unique;
  Vec_Ptr_t *pVVar6;
  void *pvVar7;
  undefined8 uVar8;
  Extra_SymmInfo_t *p;
  char *pcVar9;
  bool bVar10;
  long lVar11;
  char *pcVar12;
  long lVar13;
  int iVar14;
  DdNode *f;
  long lVar15;
  long lVar16;
  long lVar17;
  bool bVar18;
  long lVar19;
  timespec ts;
  uint local_a0;
  timespec local_98;
  int local_88;
  int local_84;
  void *local_80;
  DdManager *local_78;
  int local_70;
  int local_6c;
  long local_68;
  long local_60;
  long local_58;
  Abc_Ntk_t *local_50;
  char **local_48;
  long local_40;
  long local_38;
  
  local_84 = fNaive;
  if (fUseBdds == 0 && fNaive == 0) {
    uVar4 = Sim_ComputeTwoVarSymms(pNtk,fVerbose);
    printf("The total number of symmetries is %d.\n",(ulong)uVar4);
    return;
  }
  iVar3 = clock_gettime(3,&local_98);
  if (iVar3 < 0) {
    local_60 = 1;
  }
  else {
    lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_98.tv_nsec),8);
    local_60 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + local_98.tv_sec * -1000000;
  }
  unique = (DdManager *)Abc_NtkBuildGlobalBdds(pNtk,10000000,1,fReorder,0,fVerbose);
  uVar4 = Abc_NtkSizeOfGlobalBdds(pNtk);
  printf("Shared BDD size = %d nodes.\n",(ulong)uVar4);
  Cudd_AutodynDisable(unique);
  local_78 = unique;
  Cudd_zddVarsFromBddVars(unique,2);
  iVar3 = clock_gettime(3,&local_98);
  if (iVar3 < 0) {
    local_58 = -1;
  }
  else {
    local_58 = local_98.tv_nsec / 1000 + local_98.tv_sec * 1000000;
  }
  iVar3 = clock_gettime(3,&local_98);
  if (iVar3 < 0) {
    local_68 = 1;
  }
  else {
    lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_98.tv_nsec),8);
    local_68 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + local_98.tv_sec * -1000000;
  }
  pVVar6 = pNtk->vCos;
  local_88 = fReorder;
  if (pVVar6->nSize < 1) {
    local_a0 = 0;
    uVar4 = 0;
  }
  else {
    lVar11 = 0;
    uVar4 = 0;
    local_a0 = 0;
    local_70 = fVerbose;
    local_50 = pNtk;
    do {
      pObj = (Abc_Obj_t *)pVVar6->pArray[lVar11];
      pVVar6 = pObj->pNtk->vAttrs;
      local_38 = lVar11;
      if (pVVar6->nSize < 8) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      piVar1 = (int *)pVVar6->pArray[7];
      pvVar7 = *(void **)(piVar1 + 2);
      if (pvVar7 == (void *)0x0) {
        __assert_fail("p->pArrayPtr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecAtt.h"
                      ,0xf9,"void *Vec_AttEntry(Vec_Att_t *, int)");
      }
      iVar3 = pObj->Id;
      lVar11 = (long)iVar3;
      iVar5 = *piVar1;
      if (iVar5 <= iVar3) {
        iVar14 = iVar3 + 10;
        if (iVar3 < iVar5 * 2) {
          iVar14 = iVar5 * 2;
        }
        if (iVar5 < iVar14) {
          pvVar7 = realloc(pvVar7,(long)iVar14 * 8);
          pNtk = local_50;
          *(void **)(piVar1 + 2) = pvVar7;
          memset((void *)((long)pvVar7 + (long)*piVar1 * 8),0,((long)iVar14 - (long)*piVar1) * 8);
          *piVar1 = iVar14;
        }
      }
      f = *(DdNode **)((long)pvVar7 + lVar11 * 8);
      if (f == (DdNode *)0x0) {
        if (*(code **)(piVar1 + 8) == (code *)0x0) {
          f = (DdNode *)0x0;
        }
        else {
          uVar8 = (**(code **)(piVar1 + 8))(*(undefined8 *)(piVar1 + 4));
          *(undefined8 *)(*(long *)(piVar1 + 2) + lVar11 * 8) = uVar8;
          f = *(DdNode **)(*(long *)(piVar1 + 2) + lVar11 * 8);
        }
      }
      iVar3 = Cudd_SupportSize(local_78,f);
      if (*(int *)((ulong)f & 0xfffffffffffffffe) != 0x7fffffff) {
        if (local_84 == 0) {
          p = Extra_SymmPairsCompute(local_78,f);
        }
        else {
          p = Extra_SymmPairsComputeNaive(local_78,f);
        }
        local_a0 = local_a0 + p->nSymms;
        if (local_70 != 0) {
          local_6c = iVar3;
          pcVar9 = Abc_ObjName(pObj);
          printf("Output %6s (%d): ",pcVar9,(ulong)(uint)p->nSymms);
          iVar3 = pNtk->vCis->nSize;
          local_48 = Abc_NtkCollectCioNames(pNtk,0);
          pvVar7 = calloc(1,(long)iVar3 << 2);
          lVar11 = (long)p->nVars;
          local_80 = pvVar7;
          if (0 < lVar11) {
            lVar19 = 0;
            lVar13 = 0;
            lVar17 = lVar11;
            local_40 = lVar11;
            do {
              if (*(int *)((long)pvVar7 + lVar13 * 4) == 0) {
                bVar18 = true;
                bVar10 = false;
                lVar16 = 0;
                do {
                  while ((ppcVar2 = local_48, lVar15 = lVar16 + 1, lVar19 + lVar15 != 1 &&
                         (p->pSymms[lVar13][lVar16] != '\0'))) {
                    if (*(int *)((long)pvVar7 + lVar15 * 4 + -4) != 0) {
                      __assert_fail("pVarTaken[k] == 0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSymm.c"
                                    ,0xd3,
                                    "void Ntk_NetworkSymmsPrint(Abc_Ntk_t *, Extra_SymmInfo_t *)");
                    }
                    if (bVar18) {
                      printf("  { %s",local_48[p->pVars[lVar13]]);
                      *(undefined4 *)((long)local_80 + lVar13 * 4) = 1;
                    }
                    bVar18 = false;
                    printf(" %s",ppcVar2[p->pVars[lVar16]]);
                    *(undefined4 *)((long)local_80 + lVar15 * 4 + -4) = 1;
                    bVar10 = true;
                    lVar16 = lVar15;
                    lVar17 = local_40;
                    pvVar7 = local_80;
                    if (lVar15 == lVar11) goto LAB_00318fca;
                  }
                  lVar16 = lVar15;
                } while (lVar15 != lVar11);
                if (bVar10) {
LAB_00318fca:
                  printf(" }");
                  pvVar7 = local_80;
                  lVar17 = local_40;
                }
              }
              lVar13 = lVar13 + 1;
              lVar19 = lVar19 + -1;
            } while (lVar13 != lVar17);
          }
          putchar(10);
          if (local_48 != (char **)0x0) {
            free(local_48);
          }
          pNtk = local_50;
          iVar3 = local_6c;
          if (local_80 != (void *)0x0) {
            free(local_80);
          }
        }
        Extra_SymmPairsDissolve(p);
      }
      uVar4 = uVar4 + iVar3;
      lVar11 = local_38 + 1;
      pVVar6 = pNtk->vCos;
    } while (lVar11 < pVVar6->nSize);
  }
  printf("Total number of vars in functional supports = %8d.\n",(ulong)uVar4);
  printf("Total number of two-variable symmetries     = %8d.\n",(ulong)local_a0);
  iVar5 = clock_gettime(3,&local_98);
  iVar3 = local_88;
  if (iVar5 < 0) {
    lVar11 = -1;
  }
  else {
    lVar11 = local_98.tv_nsec / 1000 + local_98.tv_sec * 1000000;
  }
  lVar11 = lVar11 + local_68;
  lVar17 = local_58 + local_60;
  Abc_NtkFreeGlobalBdds(pNtk,1);
  puts("Statistics of BDD-based symmetry detection:");
  pcVar9 = "naive";
  if (local_84 == 0) {
    pcVar9 = "fast";
  }
  pcVar12 = "no";
  if (iVar3 != 0) {
    pcVar12 = "yes";
  }
  iVar3 = 0x991a1c;
  printf("Algorithm = %s. Reordering = %s. Garbage collection = %s.\n",pcVar9,pcVar12);
  Abc_Print(iVar3,"%s =","Constructing BDDs");
  Abc_Print(iVar3,"%9.2f sec\n",(double)lVar17 / 1000000.0);
  Abc_Print(iVar3,"%s =","Computing symms  ");
  Abc_Print(iVar3,"%9.2f sec\n",(double)lVar11 / 1000000.0);
  Abc_Print(iVar3,"%s =","TOTAL            ");
  Abc_Print(iVar3,"%9.2f sec\n",(double)(lVar17 + lVar11) / 1000000.0);
  return;
}

Assistant:

void Abc_NtkSymmetries( Abc_Ntk_t * pNtk, int fUseBdds, int fNaive, int fReorder, int fVerbose )
{
    if ( fUseBdds || fNaive )
        Abc_NtkSymmetriesUsingBdds( pNtk, fNaive, fReorder, fVerbose );
    else
        Abc_NtkSymmetriesUsingSandS( pNtk, fVerbose );
}